

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabLong(uint32_t *lp)

{
  ushort *puVar1;
  undefined1 uVar2;
  
  uVar2 = *(undefined1 *)((long)lp + 3);
  *(char *)((long)lp + 3) = (char)*lp;
  *(undefined1 *)lp = uVar2;
  puVar1 = (ushort *)((long)lp + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void TIFFSwabLong(uint32_t *lp)
{
    register unsigned char *cp = (unsigned char *)lp;
    unsigned char t;
    assert(sizeof(uint32_t) == 4);
    t = cp[3];
    cp[3] = cp[0];
    cp[0] = t;
    t = cp[2];
    cp[2] = cp[1];
    cp[1] = t;
}